

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_TestUnicode_Test::TestBody(PKCS12Test_TestUnicode_Test *this)

{
  string data;
  Span<const_unsigned_char> local_28;
  
  GetTestData_abi_cxx11_((string *)&local_28,"crypto/pkcs8/test/unicode_password.p12");
  TestImpl("Unicode",local_28,kUnicodePassword,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(PKCS12Test, TestUnicode) {
  // Generated with
  //   openssl pkcs12 -export -inkey ecdsa_p256_key.pem -in ecdsa_p256_cert.pem -password pass:"Hello, 世界"
  std::string data = GetTestData("crypto/pkcs8/test/unicode_password.p12");
  TestImpl("Unicode", bssl::StringAsBytes(data), kUnicodePassword, nullptr);
}